

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

void __thiscall
crnlib::mipmapped_texture::set_orientation_flags(mipmapped_texture *this,orientation_flags_t flags)

{
  uint uVar1;
  vector<crnlib::mip_level_*> *pvVar2;
  mip_level **ppmVar3;
  orientation_flags_t in_ESI;
  long in_RDI;
  uint m;
  uint l;
  undefined4 local_14;
  undefined4 local_10;
  
  local_10 = 0;
  while( true ) {
    uVar1 = vector<crnlib::vector<crnlib::mip_level_*>_>::size
                      ((vector<crnlib::vector<crnlib::mip_level_*>_> *)(in_RDI + 0x20));
    if (uVar1 <= local_10) break;
    local_14 = 0;
    while( true ) {
      pvVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                         ((vector<crnlib::vector<crnlib::mip_level_*>_> *)(in_RDI + 0x20),local_10);
      uVar1 = vector<crnlib::mip_level_*>::size(pvVar2);
      if (uVar1 <= local_14) break;
      pvVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                         ((vector<crnlib::vector<crnlib::mip_level_*>_> *)(in_RDI + 0x20),local_10);
      ppmVar3 = vector<crnlib::mip_level_*>::operator[](pvVar2,local_14);
      mip_level::set_orientation_flags(*ppmVar3,in_ESI);
      local_14 = local_14 + 1;
    }
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void mipmapped_texture::set_orientation_flags(orientation_flags_t flags) {
  for (uint l = 0; l < m_faces.size(); l++)
    for (uint m = 0; m < m_faces[l].size(); m++)
      m_faces[l][m]->set_orientation_flags(flags);
}